

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseFuncSignature
          (WastParser *this,FuncSignature *sig,BindingHash *param_bindings)

{
  Result RVar1;
  Enum EVar2;
  
  RVar1 = ParseBoundValueTypeList
                    (this,Param,&sig->param_types,param_bindings,&sig->param_type_names,0);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = ParseUnboundValueTypeList(this,Result,&sig->result_types,&sig->result_type_names);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseFuncSignature(FuncSignature* sig,
                                      BindingHash* param_bindings) {
  WABT_TRACE(ParseFuncSignature);
  CHECK_RESULT(ParseBoundValueTypeList(TokenType::Param, &sig->param_types,
                                       param_bindings, &sig->param_type_names));
  CHECK_RESULT(ParseResultList(&sig->result_types, &sig->result_type_names));
  return Result::Ok;
}